

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickcdef.c
# Opt level: O1

void av1_cdef_search(AV1_COMP *cpi)

{
  size_t __n;
  undefined4 uVar1;
  undefined4 uVar2;
  uint8_t uVar3;
  CDEF_CONTROL CVar4;
  CDEF_PICK_METHOD pick_method;
  RefCntBuffer *pRVar5;
  YV12_BUFFER_CONFIG *pYVar6;
  SequenceHeader *pSVar7;
  uint64_t (*pauVar8) [64];
  MB_MODE_INFO *pMVar9;
  int *piVar10;
  uint uVar11;
  CdefSearchCtx *pCVar12;
  code *pcVar13;
  int *piVar14;
  uint64_t (*pauVar15) [64];
  uint64_t uVar16;
  byte bVar17;
  ushort uVar18;
  int iVar19;
  uint uVar20;
  int iVar22;
  code *pcVar23;
  uint uVar24;
  size_t size;
  aom_internal_error_info *paVar25;
  int iVar26;
  aom_internal_error_info *error_info;
  ulong uVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  long lVar31;
  int iVar32;
  int pli;
  ulong uVar33;
  int iVar34;
  long lVar35;
  bool bVar36;
  int best_lev1 [16];
  uint64_t (*mse [2]) [64];
  int best_lev0 [16];
  uint local_12c;
  ulong local_120;
  int local_118;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  uint64_t (*local_88) [64];
  uint64_t (*local_80) [64];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  uint uVar21;
  
  CVar4 = (cpi->oxcf).tool_cfg.cdef_control;
  if (((CVar4 == CDEF_REFERENCE) && ((cpi->ppi->rtc_ref).non_reference_frame != 0)) ||
     ((CVar4 == CDEF_ADAPTIVE &&
      ((((cpi->oxcf).mode == '\x02' && (((cpi->oxcf).rc_cfg.mode & ~AOM_CBR) == AOM_CQ)) &&
       ((cpi->oxcf).rc_cfg.cq_level < 0x21)))))) {
    (cpi->common).cdef_info.nb_cdef_strengths = 1;
    (cpi->common).cdef_info.cdef_strengths[0] = 0;
    (cpi->common).cdef_info.cdef_bits = 0;
    (cpi->common).cdef_info.cdef_uv_strengths[0] = 0;
    return;
  }
  if ((cpi->rc).rtc_external_ratectrl == 0) {
    pick_method = (cpi->sf).lpf_sf.cdef_pick_method;
    iVar26 = (cpi->common).quant_params.base_qindex;
    if ((ulong)pick_method != 6) {
      uVar3 = ((cpi->common).seq_params)->monochrome;
      if (cpi->cdef_search_ctx == (CdefSearchCtx *)0x0) {
        pCVar12 = (CdefSearchCtx *)aom_malloc(0x1f28);
        cpi->cdef_search_ctx = pCVar12;
        if (pCVar12 == (CdefSearchCtx *)0x0) {
          aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate cpi->cdef_search_ctx");
        }
      }
      pCVar12 = cpi->cdef_search_ctx;
      pRVar5 = (cpi->common).cur_frame;
      pYVar6 = cpi->source;
      pSVar7 = (cpi->common).seq_params;
      bVar36 = pSVar7->monochrome == '\0';
      uVar24 = bVar36 + 1 + (uint)bVar36;
      pCVar12->mi_params = &(cpi->common).mi_params;
      pCVar12->ref = pYVar6;
      uVar1 = (cpi->common).mi_params.mi_rows;
      uVar2 = (cpi->common).mi_params.mi_cols;
      pCVar12->nvfb = (int)(((uint)(uVar1 + 0xf >> 0x1f) >> 0x1c) + uVar1 + 0xf) >> 4;
      pCVar12->nhfb = (int)(((uint)(uVar2 + 0xf >> 0x1f) >> 0x1c) + uVar2 + 0xf) >> 4;
      pCVar12->coeff_shift = pSVar7->bit_depth - AOM_BITS_8;
      pCVar12->damping = ((cpi->common).quant_params.base_qindex >> 6) + 3;
      iVar28 = nb_cdef_strengths[pick_method];
      pCVar12->total_strengths = iVar28;
      pCVar12->num_planes = uVar24;
      pCVar12->pick_method = pick_method;
      pCVar12->sb_count = 0;
      pCVar12->use_highbitdepth = pSVar7->use_highbitdepth != '\0';
      uVar20 = pick_method - CDEF_FAST_SEARCH_LVL1;
      uVar33 = 0;
      av1_setup_dst_planes((cpi->td).mb.e_mbd.plane,pSVar7->sb_size,&pRVar5->buf,0,0,0,uVar24);
      lVar35 = 0x547a;
      do {
        piVar14 = (int *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar35 * 4);
        iVar19 = piVar14[-1];
        pCVar12->xdec[uVar33] = iVar19;
        iVar32 = *piVar14;
        pCVar12->ydec[uVar33] = iVar32;
        bVar36 = iVar19 == 0;
        iVar19 = bVar36 + 1 + (uint)bVar36;
        if (iVar32 != 0) {
          iVar19 = (uint)bVar36 * 2;
        }
        pCVar12->bsize[uVar33] = iVar19;
        pCVar12->mi_wide_l2[uVar33] = 2 - piVar14[-1];
        pCVar12->mi_high_l2[uVar33] = 2 - *piVar14;
        memcpy((void *)(lVar35 * 4 + -0x151d8 + (long)pCVar12),piVar14 + -2,0xa30);
        uVar33 = uVar33 + 1;
        lVar35 = lVar35 + 0x28c;
      } while (uVar24 != uVar33);
      bVar36 = ((cpi->common).seq_params)->use_highbitdepth == '\0';
      pcVar13 = av1_cdef_copy_sb8_16_highbd;
      if (bVar36) {
        pcVar13 = av1_cdef_copy_sb8_16_lowbd;
      }
      pcVar23 = compute_cdef_dist_highbd;
      if (bVar36) {
        pcVar23 = compute_cdef_dist;
      }
      pCVar12->copy_fn = pcVar13;
      pCVar12->compute_cdef_dist_fn = pcVar23;
      lVar35 = (long)pCVar12->nhfb * (long)pCVar12->nvfb;
      piVar14 = (int *)aom_malloc(lVar35 * 4);
      pCVar12->sb_index = piVar14;
      if (piVar14 == (int *)0x0) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate cdef_search_ctx->sb_index");
      }
      pCVar12->sb_count = 0;
      size = lVar35 * 0x200;
      pauVar15 = (uint64_t (*) [64])aom_malloc(size);
      pCVar12->mse[0] = pauVar15;
      if (pauVar15 == (uint64_t (*) [64])0x0) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate cdef_search_ctx->mse[0]");
      }
      pauVar15 = (uint64_t (*) [64])aom_malloc(size);
      pCVar12->mse[1] = pauVar15;
      if (pauVar15 == (uint64_t (*) [64])0x0) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate cdef_search_ctx->mse[1]");
      }
      if ((cpi->mt_info).num_workers < 2) {
        if (0 < pCVar12->nvfb) {
          iVar19 = 0;
          uVar24 = 0;
          do {
            if (0 < pCVar12->nhfb) {
              lVar35 = 0;
              iVar32 = 0;
              uVar33 = 0;
              do {
                error_info = (aom_internal_error_info *)pCVar12->mi_params;
                piVar14 = (int *)error_info->detail;
                iVar29 = *(int *)((long)error_info->detail + 0x34);
                local_118 = (int)((long)(int)uVar24 * 0x10);
                local_118 = *(int *)((long)error_info->detail + 4) - local_118;
                iVar22 = 0x10;
                if (local_118 < 0x10) {
                  iVar22 = local_118;
                }
                bVar36 = local_118 < 1;
                if (0 < local_118) {
                  piVar10 = (int *)error_info->detail;
                  iVar30 = 1;
                  if (1 < iVar22) {
                    iVar30 = iVar22;
                  }
                  uVar21 = piVar10[2] + iVar32;
                  if (0xf < (int)uVar21) {
                    uVar21 = 0x10;
                  }
                  error_info = (aom_internal_error_info *)(ulong)uVar21;
                  if ((int)uVar21 < 2) {
                    error_info = (aom_internal_error_info *)0x1;
                  }
                  lVar31 = lVar35 + (long)(iVar19 * iVar29) * 8 +
                           (long)*(MB_MODE_INFO ***)(piVar14 + 10);
                  bVar36 = false;
                  iVar34 = 0;
                  do {
                    if (0 < piVar10[2] - (int)(uVar33 << 4)) {
                      paVar25 = (aom_internal_error_info *)0x0;
                      do {
                        if (*(char *)(*(long *)(lVar31 + (long)paVar25 * 8) + 0x90) == '\0')
                        goto LAB_001f9bda;
                        paVar25 = (aom_internal_error_info *)((long)&paVar25->error_code + 1);
                      } while (error_info != paVar25);
                    }
                    iVar34 = iVar34 + 1;
                    bVar36 = iVar22 <= iVar34;
                    lVar31 = lVar31 + (long)iVar29 * 8;
                  } while (iVar34 != iVar30);
                }
LAB_001f9bda:
                if (((!bVar36) &&
                    ((pMVar9 = (*(MB_MODE_INFO ***)(piVar14 + 10))
                               [uVar33 * 0x10 + (long)iVar29 * (long)(int)uVar24 * 0x10],
                     (uVar33 & 1) == 0 || ((pMVar9->bsize & ~BLOCK_4X8) != BLOCK_128X64)))) &&
                   (((uVar24 & 1) == 0 || ((pMVar9->bsize - BLOCK_64X128 & 0xfd) != 0)))) {
                  av1_cdef_mse_calc_block(pCVar12,error_info,uVar24,(int)uVar33,pCVar12->sb_count);
                  pCVar12->sb_count = pCVar12->sb_count + 1;
                }
                uVar33 = uVar33 + 1;
                iVar32 = iVar32 + -0x10;
                lVar35 = lVar35 + 0x80;
              } while ((long)uVar33 < (long)pCVar12->nhfb);
            }
            uVar24 = uVar24 + 1;
            iVar19 = iVar19 + 0x10;
          } while ((int)uVar24 < pCVar12->nvfb);
        }
      }
      else {
        av1_cdef_mse_calc_frame_mt(cpi);
      }
      uVar24 = pCVar12->sb_count;
      pauVar15 = pCVar12->mse[0];
      pauVar8 = pCVar12->mse[1];
      iVar19 = 1;
      if (uVar3 == '\0') {
        iVar19 = iVar28;
      }
      uVar21 = iVar19 * iVar28 - 1;
      uVar11 = 0x1f;
      if (uVar21 != 0) {
        for (; uVar21 >> uVar11 == 0; uVar11 = uVar11 - 1) {
        }
      }
      local_12c = 0;
      uVar21 = (uVar11 ^ 0xffffffe0) + 0x21;
      if (iVar19 * iVar28 == 1) {
        uVar21 = 0;
      }
      iVar28 = (cpi->td).mb.rdmult;
      uVar11 = 3;
      if (uVar21 < 3) {
        uVar11 = uVar21;
      }
      local_120 = 0xffffffffffffffff;
      local_88 = pauVar15;
      local_80 = pauVar8;
      uVar21 = 0;
      do {
        bVar17 = (byte)uVar21;
        iVar19 = 1 << (bVar17 & 0x1f);
        local_48 = (undefined1  [16])0x0;
        local_58 = (undefined1  [16])0x0;
        local_68 = (undefined1  [16])0x0;
        local_78 = (undefined1  [16])0x0;
        local_98 = (undefined1  [16])0x0;
        local_a8 = (undefined1  [16])0x0;
        local_b8 = (undefined1  [16])0x0;
        local_c8 = (undefined1  [16])0x0;
        if (uVar3 == '\0') {
          iVar32 = 0;
          do {
            search_one_dual((int *)local_78,(int *)local_c8,iVar32,&local_88,uVar24,pick_method);
            iVar32 = iVar32 + 1;
          } while (iVar19 != iVar32);
          iVar32 = 4 << (bVar17 & 0x1f);
          __n = (ulong)(iVar19 - 1U) * 4;
          do {
            if (uVar21 != 0) {
              memmove(local_78,local_78 + 4,__n);
              memmove(local_c8,local_c8 + 4,__n);
            }
            uVar16 = search_one_dual((int *)local_78,(int *)local_c8,iVar19 - 1U,&local_88,uVar24,
                                     pick_method);
            iVar32 = iVar32 + -1;
          } while (iVar32 != 0);
          iVar32 = 2;
        }
        else {
          iVar32 = 0;
          do {
            uVar16 = search_one((int *)local_78,iVar32,pauVar15,uVar24,pick_method);
            iVar32 = iVar32 + 1;
          } while (iVar19 != iVar32);
          iVar32 = 1;
          if (pick_method - CDEF_PICK_FROM_Q < 0xfffffffb) {
            iVar32 = 4 << (bVar17 & 0x1f);
            do {
              if (uVar21 != 0) {
                memmove(local_78,local_78 + 4,(ulong)(iVar19 - 1U) * 4);
              }
              uVar16 = search_one((int *)local_78,iVar19 - 1U,pauVar15,uVar24,pick_method);
              iVar32 = iVar32 + -1;
            } while (iVar32 != 0);
            iVar32 = 1;
          }
        }
        uVar33 = uVar16 * 0x800 +
                 ((long)(int)(((6 << (bVar17 & 0x1f)) * iVar32 + uVar21 * uVar24) * 0x200) *
                  (long)iVar28 >> 9);
        if (uVar33 < local_120) {
          uVar27 = (ulong)(uint)(4 << (bVar17 & 0x1f));
          memcpy((cpi->common).cdef_info.cdef_strengths,local_78,uVar27);
          local_12c = uVar21;
          local_120 = uVar33;
          if (uVar3 == '\0') {
            memcpy((cpi->common).cdef_info.cdef_uv_strengths,local_c8,uVar27);
          }
        }
        bVar36 = uVar21 != uVar11;
        uVar21 = uVar21 + 1;
      } while (bVar36);
      bVar17 = (byte)local_12c & 0x1f;
      (cpi->common).cdef_info.cdef_bits = local_12c;
      (cpi->common).cdef_info.nb_cdef_strengths = 1 << bVar17;
      if (0 < (int)uVar24) {
        uVar33 = (ulong)(uint)(0 << bVar17);
        do {
          lVar35 = (long)(cpi->common).cdef_info.nb_cdef_strengths;
          uVar21 = 0;
          uVar18 = 0;
          if (0 < lVar35) {
            uVar27 = 0xffffffffffffffff;
            lVar31 = 0;
            do {
              uVar16 = pauVar15[uVar33][(cpi->common).cdef_info.cdef_strengths[lVar31]];
              if (uVar3 == '\0') {
                uVar16 = uVar16 + pauVar8[uVar33][(cpi->common).cdef_info.cdef_uv_strengths[lVar31]]
                ;
              }
              if (uVar16 < uVar27) {
                uVar27 = uVar16;
                uVar21 = (uint)lVar31;
              }
              lVar31 = lVar31 + 1;
            } while (lVar35 != lVar31);
            uVar18 = (ushort)((uVar21 & 0xf) << 0xb);
          }
          pMVar9 = (cpi->common).mi_params.mi_grid_base[pCVar12->sb_index[uVar33]];
          *(ushort *)&pMVar9->field_0xa7 = uVar18 | *(ushort *)&pMVar9->field_0xa7 & 0x87ff;
          uVar33 = uVar33 + 1;
        } while (uVar33 != uVar24);
      }
      if ((uVar20 < 5) && (lVar35 = (long)(cpi->common).cdef_info.nb_cdef_strengths, 0 < lVar35)) {
        iVar28 = 1;
        if (pick_method != CDEF_FAST_SEARCH_LVL5) {
          iVar28 = (pick_method < CDEF_FAST_SEARCH_LVL3) + 2 +
                   (uint)(pick_method < CDEF_FAST_SEARCH_LVL3);
        }
        lVar31 = 0;
        do {
          iVar19 = (cpi->common).cdef_info.cdef_strengths[lVar31];
          if (uVar20 < 5) {
            (*(code *)(&DAT_004feaa4 + *(int *)(&DAT_004feaa4 + (ulong)uVar20 * 4)))();
            return;
          }
          iVar32 = (cpi->common).cdef_info.cdef_uv_strengths[lVar31];
          (cpi->common).cdef_info.cdef_strengths[lVar31] = iVar19 % iVar28 + (iVar19 / iVar28) * 4;
          if (uVar20 < 5) {
            (*(code *)(&DAT_004feab8 + *(int *)(&DAT_004feab8 + (ulong)uVar20 * 4)))();
            return;
          }
          (cpi->common).cdef_info.cdef_uv_strengths[lVar31] =
               iVar32 % iVar28 + (iVar32 / iVar28) * 4;
          lVar31 = lVar31 + 1;
        } while (lVar35 != lVar31);
      }
      if ((((CVar4 == CDEF_ADAPTIVE) && ((cpi->oxcf).mode == '\x02')) &&
          (((cpi->oxcf).rc_cfg.mode & ~AOM_CBR) == AOM_CQ)) &&
         (((cpi->oxcf).rc_cfg.cq_level < 0xdd &&
          (lVar35 = (long)(cpi->common).cdef_info.nb_cdef_strengths, 0 < lVar35)))) {
        lVar31 = 0;
        do {
          iVar28 = (cpi->common).cdef_info.cdef_strengths[lVar31];
          iVar19 = (cpi->common).cdef_info.cdef_uv_strengths[lVar31];
          iVar32 = iVar28 + 3;
          if (-1 < iVar28) {
            iVar32 = iVar28;
          }
          iVar29 = iVar19 + 3;
          if (-1 < iVar19) {
            iVar29 = iVar19;
          }
          (cpi->common).cdef_info.cdef_strengths[lVar31] =
               (iVar28 % 4 >> 1) + (iVar32 >> 2 & 0xfffffffeU) * 2;
          (cpi->common).cdef_info.cdef_uv_strengths[lVar31] =
               (iVar19 % 4 >> 1) + (iVar29 >> 2 & 0xfffffffeU) * 2;
          lVar31 = lVar31 + 1;
        } while (lVar35 != lVar31);
      }
      (cpi->common).cdef_info.cdef_damping = (iVar26 >> 6) + 3;
      av1_cdef_dealloc_data(pCVar12);
      return;
    }
    iVar28 = (cpi->sf).rt_sf.screen_content_cdef_filter_qindex_thresh;
    iVar19 = (cpi->rc).best_quality + 5;
    if (iVar19 < iVar28) {
      iVar19 = iVar28;
    }
    uVar20 = 0;
    if (iVar19 < iVar26) {
      uVar20 = (uint)((cpi->oxcf).tune_cfg.content == AOM_CONTENT_SCREEN);
    }
    iVar26 = (cpi->sf).rt_sf.skip_cdef_sb;
  }
  else {
    iVar26 = 0;
    uVar20 = 0;
  }
  av1_pick_cdef_from_qp(&cpi->common,iVar26,uVar20);
  return;
}

Assistant:

void av1_cdef_search(AV1_COMP *cpi) {
  AV1_COMMON *cm = &cpi->common;
  CDEF_CONTROL cdef_control = cpi->oxcf.tool_cfg.cdef_control;

  assert(cdef_control != CDEF_NONE);
  // For CDEF_ADAPTIVE, turning off CDEF around qindex 32 was best for still
  // pictures
  if ((cdef_control == CDEF_REFERENCE &&
       cpi->ppi->rtc_ref.non_reference_frame) ||
      (cdef_control == CDEF_ADAPTIVE && cpi->oxcf.mode == ALLINTRA &&
       (cpi->oxcf.rc_cfg.mode == AOM_Q || cpi->oxcf.rc_cfg.mode == AOM_CQ) &&
       cpi->oxcf.rc_cfg.cq_level <= 32)) {
    CdefInfo *const cdef_info = &cm->cdef_info;
    cdef_info->nb_cdef_strengths = 1;
    cdef_info->cdef_bits = 0;
    cdef_info->cdef_strengths[0] = 0;
    cdef_info->cdef_uv_strengths[0] = 0;
    return;
  }

  // Indicate if external RC is used for testing
  const int rtc_ext_rc = cpi->rc.rtc_external_ratectrl;
  if (rtc_ext_rc) {
    av1_pick_cdef_from_qp(cm, 0, 0);
    return;
  }
  CDEF_PICK_METHOD pick_method = cpi->sf.lpf_sf.cdef_pick_method;
  if (pick_method == CDEF_PICK_FROM_Q) {
    const int use_screen_content_model =
        cm->quant_params.base_qindex >
            AOMMAX(cpi->sf.rt_sf.screen_content_cdef_filter_qindex_thresh,
                   cpi->rc.best_quality + 5) &&
        cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN;
    av1_pick_cdef_from_qp(cm, cpi->sf.rt_sf.skip_cdef_sb,
                          use_screen_content_model);
    return;
  }
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const int damping = 3 + (cm->quant_params.base_qindex >> 6);
  const int fast = (pick_method >= CDEF_FAST_SEARCH_LVL1 &&
                    pick_method <= CDEF_FAST_SEARCH_LVL5);
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *xd = &cpi->td.mb.e_mbd;

  if (!cpi->cdef_search_ctx)
    CHECK_MEM_ERROR(cm, cpi->cdef_search_ctx,
                    aom_malloc(sizeof(*cpi->cdef_search_ctx)));
  CdefSearchCtx *cdef_search_ctx = cpi->cdef_search_ctx;

  // Initialize parameters related to CDEF search context.
  cdef_params_init(&cm->cur_frame->buf, cpi->source, cm, xd, cdef_search_ctx,
                   pick_method);
  // Allocate CDEF search context buffers.
  cdef_alloc_data(cm, cdef_search_ctx);
  // Frame level mse calculation.
  if (cpi->mt_info.num_workers > 1) {
    av1_cdef_mse_calc_frame_mt(cpi);
  } else {
    cdef_mse_calc_frame(cdef_search_ctx, cm->error);
  }

  /* Search for different number of signaling bits. */
  int nb_strength_bits = 0;
  uint64_t best_rd = UINT64_MAX;
  CdefInfo *const cdef_info = &cm->cdef_info;
  int sb_count = cdef_search_ctx->sb_count;
  uint64_t(*mse[2])[TOTAL_STRENGTHS];
  mse[0] = cdef_search_ctx->mse[0];
  mse[1] = cdef_search_ctx->mse[1];
  /* Calculate the maximum number of bits required to signal CDEF strengths at
   * block level */
  const int total_strengths = nb_cdef_strengths[pick_method];
  const int joint_strengths =
      num_planes > 1 ? total_strengths * total_strengths : total_strengths;
  const int max_signaling_bits =
      joint_strengths == 1 ? 0 : get_msb(joint_strengths - 1) + 1;
  int rdmult = cpi->td.mb.rdmult;
  for (int i = 0; i <= 3; i++) {
    if (i > max_signaling_bits) break;
    int best_lev0[CDEF_MAX_STRENGTHS] = { 0 };
    int best_lev1[CDEF_MAX_STRENGTHS] = { 0 };
    const int nb_strengths = 1 << i;
    uint64_t tot_mse;
    if (num_planes > 1) {
      tot_mse = joint_strength_search_dual(best_lev0, best_lev1, nb_strengths,
                                           mse, sb_count, pick_method);
    } else {
      tot_mse = joint_strength_search(best_lev0, nb_strengths, mse[0], sb_count,
                                      pick_method);
    }

    const int total_bits = sb_count * i + nb_strengths * CDEF_STRENGTH_BITS *
                                              (num_planes > 1 ? 2 : 1);
    const int rate_cost = av1_cost_literal(total_bits);
    const uint64_t dist = tot_mse * 16;
    const uint64_t rd = RDCOST(rdmult, rate_cost, dist);
    if (rd < best_rd) {
      best_rd = rd;
      nb_strength_bits = i;
      memcpy(cdef_info->cdef_strengths, best_lev0,
             nb_strengths * sizeof(best_lev0[0]));
      if (num_planes > 1) {
        memcpy(cdef_info->cdef_uv_strengths, best_lev1,
               nb_strengths * sizeof(best_lev1[0]));
      }
    }
  }

  cdef_info->cdef_bits = nb_strength_bits;
  cdef_info->nb_cdef_strengths = 1 << nb_strength_bits;
  for (int i = 0; i < sb_count; i++) {
    uint64_t best_mse = UINT64_MAX;
    int best_gi = 0;
    for (int gi = 0; gi < cdef_info->nb_cdef_strengths; gi++) {
      uint64_t curr = mse[0][i][cdef_info->cdef_strengths[gi]];
      if (num_planes > 1) curr += mse[1][i][cdef_info->cdef_uv_strengths[gi]];
      if (curr < best_mse) {
        best_gi = gi;
        best_mse = curr;
      }
    }
    mi_params->mi_grid_base[cdef_search_ctx->sb_index[i]]->cdef_strength =
        best_gi;
  }
  if (fast) {
    for (int j = 0; j < cdef_info->nb_cdef_strengths; j++) {
      const int luma_strength = cdef_info->cdef_strengths[j];
      const int chroma_strength = cdef_info->cdef_uv_strengths[j];
      int pri_strength, sec_strength;

      STORE_CDEF_FILTER_STRENGTH(cdef_info->cdef_strengths[j], pick_method,
                                 luma_strength);
      STORE_CDEF_FILTER_STRENGTH(cdef_info->cdef_uv_strengths[j], pick_method,
                                 chroma_strength);
    }
  }

  // For CDEF_ADAPTIVE, set primary and secondary CDEF at reduced strength for
  // qindexes 33 through 220.
  // Note 1: for odd strengths, the 0.5 discarded by ">> 1" is a significant
  // part of the strength when the strength is small, and because there are
  // few strength levels, odd strengths are reduced significantly more than a
  // half. This is intended behavior for reduced strength.
  // For example: a pri strength of 3 becomes 1, and a sec strength of 1
  // becomes 0.
  // Note 2: a (signaled) sec strength value of 3 is special as it results in an
  // actual sec strength of 4. We tried adding +1 to the sec strength 3 so it
  // maps to a reduced sec strength of 2. However, on Daala's subset1, the
  // resulting SSIMULACRA 2 scores were either exactly the same (at cpu-used 6),
  // or within noise level (at cpu-used 3). Given that there were no discernible
  // improvements, this special mapping was left out for reduced strength.
  if (cdef_control == CDEF_ADAPTIVE && cpi->oxcf.mode == ALLINTRA &&
      (cpi->oxcf.rc_cfg.mode == AOM_Q || cpi->oxcf.rc_cfg.mode == AOM_CQ) &&
      cpi->oxcf.rc_cfg.cq_level <= 220) {
    for (int j = 0; j < cdef_info->nb_cdef_strengths; j++) {
      const int luma_strength = cdef_info->cdef_strengths[j];
      const int chroma_strength = cdef_info->cdef_uv_strengths[j];

      const int new_pri_luma_strength =
          (luma_strength / CDEF_SEC_STRENGTHS) >> 1;
      const int new_sec_luma_strength =
          (luma_strength % CDEF_SEC_STRENGTHS) >> 1;
      const int new_pri_chroma_strength =
          (chroma_strength / CDEF_SEC_STRENGTHS) >> 1;
      const int new_sec_chroma_strength =
          (chroma_strength % CDEF_SEC_STRENGTHS) >> 1;

      cdef_info->cdef_strengths[j] =
          new_pri_luma_strength * CDEF_SEC_STRENGTHS + new_sec_luma_strength;
      cdef_info->cdef_uv_strengths[j] =
          new_pri_chroma_strength * CDEF_SEC_STRENGTHS +
          new_sec_chroma_strength;
    }
  }

  cdef_info->cdef_damping = damping;
  // Deallocate CDEF search context buffers.
  av1_cdef_dealloc_data(cdef_search_ctx);
}